

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_utils.h
# Opt level: O0

int sunsnprintf(char *buffer,size_t bufsz,char *format,...)

{
  char in_AL;
  int iVar1;
  __va_list_tag *in_R8;
  char *in_R9;
  size_t in_XMM0_Qa;
  char *in_XMM0_Qb;
  va_list args;
  int size;
  size_t in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  
  if (in_AL != '\0') {
    in_stack_ffffffffffffff48 = in_XMM0_Qa;
    in_stack_ffffffffffffff50 = in_XMM0_Qb;
  }
  iVar1 = sunvsnprintf(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_R9,in_R8);
  return iVar1;
}

Assistant:

static inline int sunsnprintf(char* buffer, size_t bufsz, const char* format, ...)
{
  int size = 0;
  va_list args;
  va_start(args, format);
  size = sunvsnprintf(buffer, bufsz, format, args);
  va_end(args);
  return size;
}